

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O2

mat4 * viewport(mat4 *__return_storage_ptr__,int x,int y,int w,int h)

{
  mat<4UL,_4UL>::identity();
  __return_storage_ptr__->rows[0].data[3] = (double)((float)x + (float)w * 0.5);
  __return_storage_ptr__->rows[1].data[3] = (double)((float)y + (float)h * 0.5);
  __return_storage_ptr__->rows[0].data[0] = (double)((float)w * 0.5);
  __return_storage_ptr__->rows[1].data[1] = (double)((float)h * 0.5);
  __return_storage_ptr__->rows[2].data[2] = 127.5;
  __return_storage_ptr__->rows[2].data[3] = 127.5;
  return __return_storage_ptr__;
}

Assistant:

mat4 viewport(int x, int y, int w, int h)
{
    mat4 Viewport = mat4::identity();
    Viewport[0][3] = x + w / 2.f;
    Viewport[1][3] = y + h / 2.f;
    Viewport[2][3] = 255.f / 2.f;
    Viewport[0][0] = w / 2.f;
    Viewport[1][1] = h / 2.f;
    Viewport[2][2] = 255.f / 2.f;
    return Viewport;
}